

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPLoader.cpp
# Opt level: O3

void __thiscall Assimp::HMPImporter::InternReadFile_HMP7(HMPImporter *this)

{
  aiVector3D **__s;
  size_t __n;
  int iVar1;
  uchar *puVar2;
  undefined1 auVar3 [16];
  aiMesh **ppaVar4;
  aiMesh *paVar5;
  ulong uVar6;
  aiVector3D *paVar7;
  aiNode *paVar8;
  uint *puVar9;
  aiVector3D *paVar10;
  uint uVar11;
  ushort *puVar12;
  uint uVar13;
  ushort *szPos;
  uint height;
  ulong uVar14;
  uint width;
  float fVar15;
  float fVar16;
  float fVar17;
  uchar *szCurrent;
  ushort *local_38;
  
  puVar2 = (this->super_MDLImporter).mBuffer;
  local_38 = (ushort *)(puVar2 + 0x54);
  ValidateHeader_HMP457(this);
  ((this->super_MDLImporter).pScene)->mNumMeshes = 1;
  ppaVar4 = (aiMesh **)operator_new__(8);
  ((this->super_MDLImporter).pScene)->mMeshes = ppaVar4;
  paVar5 = (aiMesh *)operator_new(0x520);
  paVar5->mPrimitiveTypes = 0;
  paVar5->mNumVertices = 0;
  paVar5->mNumFaces = 0;
  __s = &paVar5->mVertices;
  memset(__s,0,0xcc);
  paVar5->mBones = (aiBone **)0x0;
  paVar5->mMaterialIndex = 0;
  (paVar5->mName).length = 0;
  (paVar5->mName).data[0] = '\0';
  memset((paVar5->mName).data + 1,0x1b,0x3ff);
  paVar5->mNumAnimMeshes = 0;
  paVar5->mAnimMeshes = (aiAnimMesh **)0x0;
  paVar5->mMethod = 0;
  (paVar5->mAABB).mMin.x = 0.0;
  (paVar5->mAABB).mMin.y = 0.0;
  (paVar5->mAABB).mMin.z = 0.0;
  (paVar5->mAABB).mMax.x = 0.0;
  (paVar5->mAABB).mMax.y = 0.0;
  (paVar5->mAABB).mMax.z = 0.0;
  memset(paVar5->mColors,0,0xa0);
  *((this->super_MDLImporter).pScene)->mMeshes = paVar5;
  iVar1 = *(int *)(puVar2 + 0x3c);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)iVar1;
  uVar6 = SUB168(auVar3 * ZEXT816(0xc),0);
  uVar14 = 0xffffffffffffffff;
  if (SUB168(auVar3 * ZEXT816(0xc),8) == 0) {
    uVar14 = uVar6;
  }
  paVar7 = (aiVector3D *)operator_new__(uVar14);
  if (iVar1 == 0) {
    *__s = paVar7;
    paVar7 = (aiVector3D *)operator_new__(uVar14);
  }
  else {
    __n = ((uVar6 - 0xc) / 0xc) * 0xc + 0xc;
    memset(paVar7,0,__n);
    *__s = paVar7;
    paVar7 = (aiVector3D *)operator_new__(uVar14);
    memset(paVar7,0,__n);
  }
  paVar5->mNormals = paVar7;
  uVar14 = (ulong)((float)iVar1 / *(float *)(puVar2 + 0x2c));
  uVar6 = (ulong)*(float *)(puVar2 + 0x2c);
  CreateMaterial(this,puVar2 + 0x54,(uchar **)&local_38);
  puVar12 = local_38 + 0x12;
  height = (uint)uVar14;
  width = (uint)uVar6;
  szPos = local_38 + (uVar6 & 0xffffffff) * (uVar14 & 0xffffffff) * 2 + 0x12;
  local_38 = puVar12;
  MDLImporter::SizeCheck(&this->super_MDLImporter,szPos);
  if (height != 0) {
    paVar7 = paVar5->mVertices;
    paVar10 = paVar5->mNormals;
    uVar11 = 0;
    do {
      if (width != 0) {
        uVar13 = 0;
        do {
          paVar7->x = (float)uVar13 * *(float *)(puVar2 + 0x24);
          paVar7->y = *(float *)(puVar2 + 0x28) * (float)uVar11;
          paVar7->z = ((float)*puVar12 / 65535.0 + -0.5) * *(float *)(puVar2 + 0x24) * 8.0;
          fVar15 = (float)(int)(char)(uchar)puVar12[1] * 0.0078125;
          paVar10->x = fVar15;
          fVar16 = (float)(int)(char)*(uchar *)((long)puVar12 + 3) * 0.0078125;
          fVar17 = 1.0 / SQRT(fVar15 * fVar15 + fVar16 * fVar16 + 1.0);
          paVar10->x = fVar17 * fVar15;
          paVar10->y = fVar17 * fVar16;
          paVar10->z = fVar17;
          paVar7 = paVar7 + 1;
          paVar10 = paVar10 + 1;
          puVar12 = puVar12 + 2;
          uVar13 = uVar13 + 1;
        } while (width != uVar13);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != height);
  }
  if (*(int *)(puVar2 + 0x30) != 0) {
    GenerateTextureCoords(this,width,height);
  }
  CreateOutputFaceList(this,width,height);
  paVar8 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar8);
  ((this->super_MDLImporter).pScene)->mRootNode = paVar8;
  paVar8 = ((this->super_MDLImporter).pScene)->mRootNode;
  (paVar8->mName).length = 0xc;
  builtin_strncpy((paVar8->mName).data,"terrain_root",0xd);
  ((this->super_MDLImporter).pScene)->mRootNode->mNumMeshes = 1;
  puVar9 = (uint *)operator_new__(4);
  ((this->super_MDLImporter).pScene)->mRootNode->mMeshes = puVar9;
  *((this->super_MDLImporter).pScene)->mRootNode->mMeshes = 0;
  return;
}

Assistant:

void HMPImporter::InternReadFile_HMP7( )
{
    // read the file header and skip everything to byte 84
    const HMP::Header_HMP5* const pcHeader = (const HMP::Header_HMP5*)mBuffer;
    const unsigned char* szCurrent = (const unsigned char*)(mBuffer+84);
    ValidateHeader_HMP457();

    // generate an output mesh
    pScene->mNumMeshes = 1;
    pScene->mMeshes = new aiMesh*[1];
    aiMesh* pcMesh = pScene->mMeshes[0] = new aiMesh();

    pcMesh->mMaterialIndex = 0;
    pcMesh->mVertices = new aiVector3D[pcHeader->numverts];
    pcMesh->mNormals = new aiVector3D[pcHeader->numverts];

    const unsigned int height = (unsigned int)(pcHeader->numverts / pcHeader->fnumverts_x);
    const unsigned int width = (unsigned int)pcHeader->fnumverts_x;

    // generate/load a material for the terrain
    CreateMaterial(szCurrent,&szCurrent);

    // goto offset 120, I don't know why ...
    // (fixme) is this the frame header? I assume yes since it starts with 2.
    szCurrent += 36;

    SizeCheck(szCurrent + sizeof(const HMP::Vertex_HMP7)*height*width);

    // now load all vertices from the file
    aiVector3D* pcVertOut = pcMesh->mVertices;
    aiVector3D* pcNorOut = pcMesh->mNormals;
    const HMP::Vertex_HMP7* src = (const HMP::Vertex_HMP7*) szCurrent;
    for (unsigned int y = 0; y < height;++y)
    {
        for (unsigned int x = 0; x < width;++x)
        {
            pcVertOut->x = x * pcHeader->ftrisize_x;
            pcVertOut->y = y * pcHeader->ftrisize_y;

            // FIXME: What exctly is the correct scaling factor to use?
            // possibly pcHeader->scale_origin[2] in combination with a
            // signed interpretation of src->z?
            pcVertOut->z = (((float)src->z / 0xffff)-0.5f) * pcHeader->ftrisize_x * 8.0f;

            pcNorOut->x = ((float)src->normal_x / 0x80 ); // * pcHeader->scale_origin[0];
            pcNorOut->y = ((float)src->normal_y / 0x80 ); // * pcHeader->scale_origin[1];
            pcNorOut->z = 1.0f;
            pcNorOut->Normalize();

            ++pcVertOut;++pcNorOut;++src;
        }
    }

    // generate texture coordinates if necessary
    if (pcHeader->numskins)GenerateTextureCoords(width,height);

    // now build a list of faces
    CreateOutputFaceList(width,height);

    // there is no nodegraph in HMP files. Simply assign the one mesh
    // (no, not the One Ring) to the root node
    pScene->mRootNode = new aiNode();
    pScene->mRootNode->mName.Set("terrain_root");
    pScene->mRootNode->mNumMeshes = 1;
    pScene->mRootNode->mMeshes = new unsigned int[1];
    pScene->mRootNode->mMeshes[0] = 0;
}